

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::PassRunner::runPass(PassRunner *this,Pass *pass)

{
  int iVar1;
  size_type sVar2;
  AfterEffectModuleChecker *this_00;
  PassRunner *pPVar3;
  pointer this_01;
  unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  local_48 [3];
  unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  local_30;
  unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  checker;
  Pass *pass_local;
  PassRunner *this_local;
  
  iVar1 = (*pass->_vptr_Pass[4])();
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x3ba,"void wasm::PassRunner::runPass(Pass *)");
  }
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&(this->options).passesToSkip,&pass->name);
  if (sVar2 == 0) {
    std::
    unique_ptr<wasm::AfterEffectModuleChecker,std::default_delete<wasm::AfterEffectModuleChecker>>::
    unique_ptr<std::default_delete<wasm::AfterEffectModuleChecker>,void>
              ((unique_ptr<wasm::AfterEffectModuleChecker,std::default_delete<wasm::AfterEffectModuleChecker>>
                *)&local_30);
    iVar1 = getPassDebug();
    if (iVar1 != 0) {
      this_00 = (AfterEffectModuleChecker *)operator_new(0x28);
      AfterEffectModuleChecker::AfterEffectModuleChecker(this_00,this->wasm);
      std::
      unique_ptr<wasm::AfterEffectModuleChecker,std::default_delete<wasm::AfterEffectModuleChecker>>
      ::unique_ptr<std::default_delete<wasm::AfterEffectModuleChecker>,void>
                ((unique_ptr<wasm::AfterEffectModuleChecker,std::default_delete<wasm::AfterEffectModuleChecker>>
                  *)local_48,this_00);
      std::
      unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
      ::operator=(&local_30,local_48);
      std::
      unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
      ::~unique_ptr(local_48);
    }
    pPVar3 = Pass::getPassRunner(pass);
    if (pPVar3 != (PassRunner *)0x0) {
      __assert_fail("!pass->getPassRunner()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                    ,0x3c8,"void wasm::PassRunner::runPass(Pass *)");
    }
    Pass::setPassRunner(pass,this);
    (*pass->_vptr_Pass[2])(pass,this->wasm);
    handleAfterEffects(this,pass,(Function *)0x0);
    iVar1 = getPassDebug();
    if (iVar1 != 0) {
      this_01 = std::
                unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
                ::operator->(&local_30);
      AfterEffectModuleChecker::check(this_01);
    }
    std::
    unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
    ::~unique_ptr(&local_30);
  }
  else {
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->skippedPasses,&pass->name);
  }
  return;
}

Assistant:

void PassRunner::runPass(Pass* pass) {
  assert(!pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    skippedPasses.insert(pass->name);
    return;
  }

  std::unique_ptr<AfterEffectModuleChecker> checker;
  if (getPassDebug()) {
    checker = std::unique_ptr<AfterEffectModuleChecker>(
      new AfterEffectModuleChecker(wasm));
  }
  // Passes can only be run once and we deliberately do not clear the pass
  // runner after running the pass, so there must not already be a runner here.
  assert(!pass->getPassRunner());
  pass->setPassRunner(this);
  pass->run(wasm);
  handleAfterEffects(pass);
  if (getPassDebug()) {
    checker->check();
  }
}